

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintStamp.cpp
# Opt level: O0

void __thiscall OpenMD::ConstraintStamp::validate(ConstraintStamp *this)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long in_RDI;
  double data;
  DataHolder *in_stack_00000150;
  ParamConstraintFacade<OpenMD::NonNegativeConstraint> *in_stack_ffffffffffffff58;
  string local_58 [48];
  NonNegativeConstraint local_28;
  
  DataHolder::validate(in_stack_00000150);
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x68));
  if (!bVar1) {
    isNonNegative();
    data = Parameter<double>::getData((Parameter<double> *)(in_RDI + 0x68));
    bVar1 = NonNegativeConstraint::operator()(&local_28,data);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x31cffa);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x68));
      uVar2 = std::__cxx11::string::c_str();
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                (in_stack_ffffffffffffff58);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar2,uVar3);
      std::__cxx11::string::~string(local_58);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x31d082);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void ConstraintStamp::validate() {
    DataHolder::validate();
    CheckParameter(ConstrainedDistance, isNonNegative());
  }